

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O3

QWidget * __thiscall
QStyledItemDelegate::createEditor
          (QStyledItemDelegate *this,QWidget *parent,QStyleOptionViewItem *option,QModelIndex *index
          )

{
  uint uVar1;
  int iVar2;
  QItemEditorFactory *pQVar3;
  undefined4 extraout_var;
  QAbstractItemModel *pQVar5;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  long local_20;
  QWidget *pQVar4;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (index->m).ptr;
  if (pQVar5 == (QAbstractItemModel *)0x0 || (index->c | index->r) < 0) {
    pQVar4 = (QWidget *)0x0;
    goto LAB_0055eae2;
  }
  pQVar3 = *(QItemEditorFactory **)(*(long *)(this + 8) + 0x78);
  if (pQVar3 == (QItemEditorFactory *)0x0) {
    pQVar3 = QItemEditorFactory::defaultFactory();
    pQVar5 = (index->m).ptr;
    if (pQVar5 != (QAbstractItemModel *)0x0) goto LAB_0055eaa6;
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
    local_30 = 2;
  }
  else {
LAB_0055eaa6:
    (**(code **)(*(long *)pQVar5 + 0x90))(&local_48,pQVar5,index,2);
  }
  uVar1 = ::QVariant::typeId((QVariant *)&local_48);
  iVar2 = (*pQVar3->_vptr_QItemEditorFactory[2])(pQVar3,(ulong)uVar1,parent);
  pQVar4 = (QWidget *)CONCAT44(extraout_var,iVar2);
  ::QVariant::~QVariant((QVariant *)&local_48);
LAB_0055eae2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QStyledItemDelegate::createEditor(QWidget *parent,
                                     const QStyleOptionViewItem &option,
                                     const QModelIndex &index) const
{
    Q_UNUSED(option);
    Q_D(const QStyledItemDelegate);
    if (!index.isValid())
        return nullptr;
    return d->editorFactory()->createEditor(index.data(Qt::EditRole).userType(), parent);
}